

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testValidDeconvolution(void)

{
  RepeatedField<long> *this;
  pointer pcVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  Type *pTVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  TypeUnion this_00;
  Type *this_01;
  ConvolutionLayerParams *pCVar7;
  ValidPadding *this_02;
  WeightParams *pWVar8;
  ostream *poVar9;
  int iVar10;
  int iVar11;
  Result res;
  Model m1;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar3);
    local_50.description_ = pMVar3;
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_78 + 0x10;
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar4->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (pTVar4->type_ == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    pTVar4->type_ = pFVar5;
  }
  pFVar5 = pTVar4->type_;
  if (pFVar5->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    pAVar6 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar6);
    (pFVar5->Type_).multiarraytype_ = pAVar6;
  }
  pAVar6 = (pFVar5->Type_).multiarraytype_;
  this = &pAVar6->shape_;
  iVar11 = (pAVar6->shape_).total_size_;
  if ((pAVar6->shape_).current_size_ == iVar11) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar11 + 1);
  }
  iVar11 = (pAVar6->shape_).current_size_;
  iVar10 = iVar11 + 1;
  (pAVar6->shape_).current_size_ = iVar10;
  ((pAVar6->shape_).rep_)->elements[iVar11] = 3;
  iVar11 = (pAVar6->shape_).total_size_;
  if (iVar10 == iVar11) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar11 + 1);
  }
  iVar11 = (pAVar6->shape_).current_size_;
  iVar10 = iVar11 + 1;
  (pAVar6->shape_).current_size_ = iVar10;
  ((pAVar6->shape_).rep_)->elements[iVar11] = 100;
  iVar11 = (pAVar6->shape_).total_size_;
  if (iVar10 == iVar11) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar11 + 1);
  }
  iVar11 = (pAVar6->shape_).current_size_;
  (pAVar6->shape_).current_size_ = iVar11 + 1;
  ((pAVar6->shape_).rep_)->elements[iVar11] = 100;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar3);
    local_50.description_ = pMVar3;
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar4->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (pTVar4->type_ == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    pTVar4->type_ = pFVar5;
  }
  pFVar5 = pTVar4->type_;
  if (pFVar5->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    pAVar6 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar6);
    (pFVar5->Type_).multiarraytype_ = pAVar6;
  }
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = this_00.pipelineclassifier_;
  }
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  if (this_01->_oneof_case_[0] != 100) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 100;
    pCVar7 = (ConvolutionLayerParams *)operator_new(0xb0);
    CoreML::Specification::ConvolutionLayerParams::ConvolutionLayerParams(pCVar7);
    (this_01->layer_).convolution_ = pCVar7;
  }
  pCVar7 = (this_01->layer_).convolution_;
  pCVar7->outputchannels_ = 5;
  pCVar7->kernelchannels_ = 3;
  iVar11 = (pCVar7->kernelsize_).total_size_;
  if ((pCVar7->kernelsize_).current_size_ == iVar11) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar7->kernelsize_,iVar11 + 1);
  }
  iVar11 = (pCVar7->kernelsize_).current_size_;
  iVar10 = iVar11 + 1;
  (pCVar7->kernelsize_).current_size_ = iVar10;
  ((pCVar7->kernelsize_).rep_)->elements[iVar11] = 2;
  iVar11 = (pCVar7->kernelsize_).total_size_;
  if (iVar10 == iVar11) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar7->kernelsize_,iVar11 + 1);
  }
  iVar11 = (pCVar7->kernelsize_).current_size_;
  (pCVar7->kernelsize_).current_size_ = iVar11 + 1;
  ((pCVar7->kernelsize_).rep_)->elements[iVar11] = 5;
  pCVar7->isdeconvolution_ = true;
  pCVar7->hasbias_ = true;
  iVar11 = (pCVar7->outputshape_).total_size_;
  if ((pCVar7->outputshape_).current_size_ == iVar11) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar7->outputshape_,iVar11 + 1);
  }
  iVar11 = (pCVar7->outputshape_).current_size_;
  iVar10 = iVar11 + 1;
  (pCVar7->outputshape_).current_size_ = iVar10;
  ((pCVar7->outputshape_).rep_)->elements[iVar11] = 0x6e;
  iVar11 = (pCVar7->outputshape_).total_size_;
  if (iVar10 == iVar11) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar7->outputshape_,iVar11 + 1);
  }
  iVar11 = (pCVar7->outputshape_).current_size_;
  (pCVar7->outputshape_).current_size_ = iVar11 + 1;
  ((pCVar7->outputshape_).rep_)->elements[iVar11] = 0x6e;
  if (pCVar7->_oneof_case_[0] != 0x32) {
    CoreML::Specification::ConvolutionLayerParams::clear_ConvolutionPaddingType(pCVar7);
    pCVar7->_oneof_case_[0] = 0x32;
    this_02 = (ValidPadding *)operator_new(0x20);
    CoreML::Specification::ValidPadding::ValidPadding(this_02);
    (pCVar7->ConvolutionPaddingType_).valid_ = this_02;
  }
  iVar11 = 0x96;
  do {
    if (pCVar7->weights_ == (WeightParams *)0x0) {
      pWVar8 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar8);
      pCVar7->weights_ = pWVar8;
    }
    pWVar8 = pCVar7->weights_;
    iVar10 = (pWVar8->floatvalue_).total_size_;
    if ((pWVar8->floatvalue_).current_size_ == iVar10) {
      google::protobuf::RepeatedField<float>::Reserve(&pWVar8->floatvalue_,iVar10 + 1);
    }
    iVar10 = (pWVar8->floatvalue_).current_size_;
    (pWVar8->floatvalue_).current_size_ = iVar10 + 1;
    ((pWVar8->floatvalue_).rep_)->elements[iVar10] = 1.0;
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  iVar11 = 5;
  do {
    if (pCVar7->bias_ == (WeightParams *)0x0) {
      pWVar8 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar8);
      pCVar7->bias_ = pWVar8;
    }
    pWVar8 = pCVar7->bias_;
    iVar10 = (pWVar8->floatvalue_).total_size_;
    if ((pWVar8->floatvalue_).current_size_ == iVar10) {
      google::protobuf::RepeatedField<float>::Reserve(&pWVar8->floatvalue_,iVar10 + 1);
    }
    iVar10 = (pWVar8->floatvalue_).current_size_;
    (pWVar8->floatvalue_).current_size_ = iVar10 + 1;
    ((pWVar8->floatvalue_).rep_)->elements[iVar10] = 1.0;
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  CoreML::validate<(MLModelType)500>((Result *)local_78,&local_50);
  bVar2 = CoreML::Result::good((Result *)local_78);
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x634);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return (uint)!bVar2;
}

Assistant:

int testValidDeconvolution() {

    Specification::Model m1;

    int output_channels = 5;
    int kernel_channels = 3;
    int kernel_height = 2;
    int kernel_width = 5;
    int nGroups = 1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution();
    params->set_outputchannels(5);
    params->set_kernelchannels(3);
    params->add_kernelsize(kernel_height);
    params->add_kernelsize(kernel_width);

    params->set_hasbias(true);

    params->set_isdeconvolution(true);
    params->add_outputshape(110);
    params->add_outputshape(110);

    (void)params->mutable_valid();

    for (int i = 0; i < output_channels * (kernel_channels / nGroups) * kernel_height * kernel_width; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    for (int i = 0; i < output_channels; i++) {
        params->mutable_bias()->add_floatvalue(1.0);
    }

    // Not specifying the right number of weights should be invalid
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    return 0;
}